

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# swipe.cc
# Opt level: O0

void sptk::swipe::Sfirst(matrix S,vector x,vector pc,vector fERBs,vector d,intvector ws,intvector ps
                        ,double nyquist,double nyquist2,double dt,int n)

{
  vector yr_vector;
  vector fERBs_00;
  matrix L_00;
  matrix S_00;
  intvector ps_00;
  vector pci_00;
  int iVar1;
  int w2_00;
  int *in_RSI;
  undefined8 in_RDI;
  long in_R9;
  matrix mVar3;
  vector vVar4;
  vector vVar5;
  undefined8 in_stack_00000008;
  double *in_stack_00000010;
  ulong in_stack_00000018;
  long in_stack_00000020;
  double *in_stack_00000038;
  undefined8 in_stack_00000040;
  int in_stack_000000b0;
  int in_stack_000000b4;
  double in_stack_000000b8;
  undefined1 in_stack_000000c0 [16];
  vector in_stack_000000d0;
  vector pci;
  vector mu;
  int psz;
  int hi;
  int lo;
  matrix L;
  int w2;
  int i;
  double **ppdVar6;
  double in_stack_fffffffffffffea8;
  double in_stack_fffffffffffffeb0;
  undefined8 in_stack_fffffffffffffeb8;
  undefined4 uStack_dc;
  undefined4 uStack_cc;
  int local_6c;
  double **ppdVar2;
  
  mVar3 = loudness(in_stack_000000d0,(vector)in_stack_000000c0,in_stack_000000b8,in_stack_000000b4,
                   in_stack_000000b0);
  vVar4.v = mVar3.m;
  vVar4._0_8_ = in_stack_00000020;
  iVar1 = bisectv((swipe *)(in_stack_00000018 & 0xffffffff),vVar4,2.0);
  vVar4 = makev(0);
  w2_00 = vVar4.x;
  vVar5 = makev(0);
  ppdVar2 = (double **)vVar5.v;
  for (local_6c = 0; local_6c < iVar1; local_6c = local_6c + 1) {
    ppdVar2[local_6c] = *(double **)(in_R9 + (long)local_6c * 8);
    vVar4.v[local_6c] = 1.0 - ABS(*(double *)(in_stack_00000020 + (long)local_6c * 8) - 1.0);
  }
  pci_00.v = in_stack_00000010;
  pci_00._0_8_ = in_stack_00000008;
  ppdVar6 = (double **)CONCAT44(uStack_dc,vVar5.x);
  L_00.m._4_4_ = uStack_cc;
  L_00.m._0_4_ = w2_00;
  S_00.m = ppdVar6;
  S_00._0_8_ = vVar4.v;
  L_00._0_8_ = in_stack_00000040;
  fERBs_00.v = in_stack_00000038;
  fERBs_00._0_8_ = in_stack_fffffffffffffeb8;
  ps_00.v = in_RSI;
  ps_00._0_8_ = in_RDI;
  Sadd(S_00,L_00,fERBs_00,pci_00,(vector)mVar3,ps_00,in_stack_fffffffffffffeb0,
       in_stack_fffffffffffffea8,vVar5.x,(int)vVar5.v,w2_00);
  mVar3.m = ppdVar2;
  mVar3._0_8_ = ppdVar6;
  freem(mVar3);
  vVar5.v = (double *)ppdVar2;
  vVar5._0_8_ = ppdVar6;
  freev(vVar5);
  yr_vector.v = (double *)ppdVar2;
  yr_vector._0_8_ = ppdVar6;
  freev(yr_vector);
  return;
}

Assistant:

void Sfirst(matrix S, vector x, vector pc, vector fERBs, vector d, 
                                           intvector ws, intvector ps, 
                                           double nyquist, double nyquist2,
                                           double dt, int n) {
    int i; 
    int w2 = ws.v[n] / 2;
    matrix L = loudness(x, fERBs, nyquist, ws.v[n], w2);
    int lo = 0; // the start of Sfirst-specific code
    int hi = bisectv(d, 2.);
    int psz = hi - lo;
    vector mu = makev(psz);
    vector pci = makev(psz);
    for (i = 0; i < hi; i++) {
        pci.v[i] = pc.v[i];
        mu.v[i] = 1. - fabs(d.v[i] - 1.);
    } // end of Sfirst-specific code
    Sadd(S, L, fERBs, pci, mu, ps, dt, nyquist2, lo, psz, w2); 
    freem(L);
    freev(mu);
    freev(pci); 
}